

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sv.c
# Opt level: O3

int status(char *unused)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  
  iVar1 = svstatus_get();
  if (iVar1 == 0) {
    return 0;
  }
  if (iVar1 == -1) {
    if (lsb == 0) {
      return 0;
    }
    goto LAB_0010299e;
  }
  uVar2 = svstatus_print(*service);
  islog = 1;
  iVar1 = chdir("log");
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 == error_noent) goto LAB_0010291d;
    buffer_puts(buffer_1,"; ");
    rc = rc + 1;
    out("warning: ","unable to change directory");
  }
  else {
    buffer_puts(buffer_1,"; ");
    iVar1 = svstatus_get();
    if (iVar1 != 0) {
      uVar2 = svstatus_print("log");
LAB_0010291d:
      buffer_puts(buffer_1,"\n");
    }
  }
  islog = 0;
  buffer_puts(buffer_1,"");
  buffer_flush(buffer_1);
  if (lsb == 0) {
    return uVar2;
  }
  if (uVar2 != 0) {
    if (uVar2 == 2) {
      done(3);
    }
    done(0);
  }
LAB_0010299e:
  done(4);
}

Assistant:

int status(char *unused) {
  int rc;

  rc =svstatus_get();
  switch(rc) { case -1: if (lsb) done(4); case 0: return(0); }
  rc =svstatus_print(*service);
  islog =1;
  if (chdir("log") == -1) {
    if (errno != error_noent) {
      outs("; ");
      warn("unable to change directory");
    }
    else outs("\n");
  }
  else {
    outs("; ");
    if (svstatus_get()) { rc =svstatus_print("log"); outs("\n"); }
  }
  islog =0;
  flush("");
  if (lsb) switch(rc) { case 1: done(0); case 2: done(3); case 0: done(4); }
  return(rc);
}